

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O3

monitor * monitor_list_get_workspace_monitor(monitor_list *monitor_list,workspace *workspace)

{
  workspace *pwVar1;
  node *pnVar2;
  
  if (workspace != (workspace *)0x0) {
    for (pnVar2 = monitor_list->monitors->head; pnVar2 != (node *)0x0; pnVar2 = pnVar2->next) {
      pwVar1 = ((monitor *)pnVar2->data)->workspace;
      if ((pwVar1 != (workspace *)0x0) && (pwVar1->index == workspace->index)) {
        return (monitor *)pnVar2->data;
      }
    }
  }
  return (monitor *)0x0;
}

Assistant:

struct monitor *monitor_list_get_workspace_monitor(const struct monitor_list *monitor_list,
                                                   const struct workspace *workspace)
{
        if (workspace == NULL) {
                return NULL;
        }

        LIST_FOR_EACH(monitor_list->monitors, monitor_item)
        {
                struct monitor *monitor = (struct monitor *)monitor_item->data;

                if (monitor->workspace == NULL) {
                        continue;
                }

                if (monitor->workspace->index == workspace->index) {
                        return monitor;
                }
        }

        return NULL;
}